

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_proxy.cpp
# Opt level: O3

void __thiscall TcpProxy::handleConnectRequest(TcpProxy *this,Connection *conn)

{
  _Atomic_word *p_Var1;
  Buffer *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  ushort uVar3;
  int iVar4;
  off_t oVar5;
  char *pcVar6;
  Logger *pLVar7;
  char *pcVar8;
  size_t sVar9;
  TimerId TVar10;
  uint __val;
  uint __len;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  element_type *peVar11;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  _Any_data local_f8;
  code *local_e8;
  code *pcStack_e0;
  shared_ptr<Liby::TcpClient> tcpClient;
  string service;
  size_type local_a8;
  undefined1 local_a0 [8];
  string host;
  Timestamp local_78;
  char address [50];
  
  this_00 = &conn->readBuf_;
  oVar5 = Liby::Buffer::size(this_00);
  if (oVar5 < 9) {
    return;
  }
  pcVar6 = Liby::Buffer::data(this_00);
  if (pcVar6[1] != '\x01' || *pcVar6 != '\x04') {
    pLVar7 = Liby::Logger::getLogger();
    Liby::Logger::log(pLVar7,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
    Liby::Connection::destroy(conn);
    return;
  }
  pcVar8 = inet_ntop(2,pcVar6 + 4,address,0x32);
  if (pcVar8 == (char *)0x0) {
    Liby::Connection::destroy(conn);
    return;
  }
  host._M_dataplus._M_p = (pointer)&host.field_2;
  sVar9 = strlen(address);
  std::__cxx11::string::_M_construct<char_const*>((string *)&host,address,address + sVar9);
  uVar3 = *(ushort *)(pcVar6 + 2) << 8 | *(ushort *)(pcVar6 + 2) >> 8;
  __val = (uint)uVar3;
  __len = 1;
  if (((9 < uVar3) && (__len = 2, 99 < uVar3)) && (__len = 3, 999 < __val)) {
    __len = 5 - (__val < 10000);
  }
  service._M_dataplus._M_p = (pointer)&service.field_2;
  std::__cxx11::string::_M_construct((ulong)&service,(char)__len);
  std::__detail::__to_chars_10_impl<unsigned_int>(service._M_dataplus._M_p,__len,__val);
  pLVar7 = Liby::Logger::getLogger();
  Liby::Logger::log(pLVar7,(double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
  Liby::Buffer::retrieve(this_00);
  Liby::EventLoopGroup::creatTcpClient((EventLoopGroup *)&tcpClient,(string *)this->group_,&host);
  _Var2 = tcpClient.super___shared_ptr<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  peVar11 = tcpClient.super___shared_ptr<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_78.tv_.tv_sec = 8;
  local_78.tv_.tv_usec = 0;
  if (tcpClient.super___shared_ptr<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (tcpClient.super___shared_ptr<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (tcpClient.super___shared_ptr<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (tcpClient.super___shared_ptr<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (tcpClient.super___shared_ptr<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  local_e8 = (code *)0x0;
  pcStack_e0 = (code *)0x0;
  local_f8._M_unused._M_object = (void *)0x0;
  local_f8._8_8_ = 0;
  local_f8._M_unused._M_object = operator_new(0x10);
  *(element_type **)local_f8._M_unused._0_8_ = peVar11;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_f8._M_unused._0_8_ + 8) =
       _Var2._M_pi;
  pcStack_e0 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/examples/tcp_proxy.cpp:54:59)>
               ::_M_invoke;
  local_e8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/examples/tcp_proxy.cpp:54:59)>
             ::_M_manager;
  TVar10 = Liby::TimerMixin::runAfter
                     (&peVar11->super_TimerMixin,&local_78,(BasicHandler *)&local_f8);
  if (local_e8 != (code *)0x0) {
    (*local_e8)(&local_f8,&local_f8,__destroy_functor);
  }
  std::__shared_ptr<Liby::Connection,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<Liby::Connection,void>
            ((__shared_ptr<Liby::Connection,(__gnu_cxx::_Lock_policy)2> *)&local_a8,
             (__weak_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2> *)
             &conn->super_enable_shared_from_this<Liby::Connection>);
  peVar11 = tcpClient.super___shared_ptr<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (local_a0 == (undefined1  [8])0x0) goto LAB_001076ca;
  if (__libc_single_threaded == '\0') {
    LOCK();
    *(_Atomic_word *)((long)local_a0 + 0xcU) = *(_Atomic_word *)((long)local_a0 + 0xcU) + 1;
    UNLOCK();
    if (local_a0 != (undefined1  [8])0x0) goto LAB_001076a9;
  }
  else {
    *(_Atomic_word *)((long)local_a0 + 0xcU) = *(_Atomic_word *)((long)local_a0 + 0xcU) + 1;
LAB_001076a9:
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0);
  }
  peVar11 = tcpClient.super___shared_ptr<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (__libc_single_threaded == '\0') {
    LOCK();
    *(_Atomic_word *)((long)local_a0 + 0xcU) = *(_Atomic_word *)((long)local_a0 + 0xcU) + 1;
    UNLOCK();
  }
  else {
    *(_Atomic_word *)((long)local_a0 + 0xcU) = *(_Atomic_word *)((long)local_a0 + 0xcU) + 1;
  }
LAB_001076ca:
  local_e8 = (code *)0x0;
  pcStack_e0 = (code *)0x0;
  local_f8._M_unused._M_object = (void *)0x0;
  local_f8._8_8_ = 0;
  local_f8._M_unused._M_object = operator_new(0x28);
  *(TcpProxy **)local_f8._M_unused._0_8_ = this;
  *(undefined ***)((long)local_f8._M_unused._0_8_ + 8) = &PTR__ProxyContext_0012f1b0;
  *(size_type *)((long)local_f8._M_unused._0_8_ + 0x10) = local_a8;
  *(undefined1 (*) [8])((long)local_f8._M_unused._0_8_ + 0x18) = local_a0;
  *(TimerId *)((long)local_f8._M_unused._0_8_ + 0x20) = TVar10;
  pcStack_e0 = std::
               _Function_handler<void_(std::shared_ptr<Liby::Connection>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/examples/tcp_proxy.cpp:57:30)>
               ::_M_invoke;
  local_e8 = std::
             _Function_handler<void_(std::shared_ptr<Liby::Connection>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/examples/tcp_proxy.cpp:57:30)>
             ::_M_manager;
  Liby::TcpClient::onConnect(peVar11,(Connector *)&local_f8);
  if (local_e8 != (code *)0x0) {
    (*local_e8)(&local_f8,&local_f8,__destroy_functor);
  }
  if (local_a0 != (undefined1  [8])0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = (_Atomic_word *)((long)local_a0 + 0xc);
      iVar4 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar4 = *(_Atomic_word *)((long)local_a0 + 0xc);
      *(int *)((long)local_a0 + 0xc) = iVar4 + -1;
    }
    if (iVar4 == 1) {
      (**(code **)(*(long *)local_a0 + 0x18))(local_a0);
    }
  }
  if (tcpClient.super___shared_ptr<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (tcpClient.super___shared_ptr<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)service._M_dataplus._M_p != &service.field_2) {
    operator_delete(service._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)host._M_dataplus._M_p != &host.field_2) {
    operator_delete(host._M_dataplus._M_p);
  }
  return;
}

Assistant:

void handleConnectRequest(Connection &conn) {
        Buffer &readBuf = conn.read();
        if (readBuf.size() < 9) {
            return;
        }

        char *base = readBuf.data();

        char ver = base[0];
        char command = base[1];

        if (ver != 4 || command != 1) {
            error("bad version %d or command %d", ver, command);
            conn.destroy();
            return;
        }

        char address[50];
        if (::inet_ntop(AF_INET, base + 4, address, 50) == nullptr) {
            conn.destroy();
            return;
        }

        string host = address;
        string service = to_string(ntohs(*(uint16_t *)(base + 2)));

        info("host: %s service: %s", host.data(), service.data());
        readBuf.retrieve();

        shared_ptr<TcpClient> tcpClient = group_.creatTcpClient(host, service);
        TimerId id = tcpClient->runAfter(Timestamp(8, 0), [tcpClient] {});

        ProxyContext context = conn.shared_from_this();
        tcpClient->onConnect([this, context, id](shared_ptr<Connection> c) {
            if (c && !context.weak_conn.expired()) {
                ProxyContext context1 = c;
                c->context_ = make_shared<ProxyContext>(context);
                auto c1 = context.weak_conn.lock();
                c1->context_ = make_shared<ProxyContext>(context1);

                c->onRead(
                    [this](Connection &connection) { onRead(connection); });
                c->onErro(
                    [this](Connection &connection) { onErro(connection); });
                c1->onRead(
                    [this](Connection &connection) { onRead(connection); });
                c1->onErro(
                    [this](Connection &connection) { onErro(connection); });
                c->enableRead();
                c1->enableRead();

                char response[8];
                response[0] = 0x0;
                response[1] = 0x5A;
                c1->send(response, 8);

                return;
            }

            if (c) {
                c->destroy();
            }

            if (!context.weak_conn.expired()) {
                context.weak_conn.lock()->destroy();
            }
        });
    }